

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

char * GetApplicationDirectory(void)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  
  memset(GetApplicationDirectory::appDir,0,0x1000);
  uVar2 = readlink("/proc/self/exe",GetApplicationDirectory::appDir,0x1000);
  if ((long)uVar2 < 1) {
    GetApplicationDirectory::appDir[0] = '.';
    GetApplicationDirectory::appDir[1] = '/';
  }
  else if (-1 < (int)uVar2) {
    pcVar3 = GetApplicationDirectory::appDir + ((int)uVar2 + 1);
    do {
      iVar1 = (int)uVar2;
      if (GetApplicationDirectory::appDir[uVar2 & 0xffffffff] == '/') {
        *pcVar3 = '\0';
        break;
      }
      pcVar3 = pcVar3 + -1;
      uVar2 = (ulong)(iVar1 - 1);
    } while (0 < iVar1);
  }
  return GetApplicationDirectory::appDir;
}

Assistant:

const char *GetApplicationDirectory(void)
{
    static char appDir[MAX_FILEPATH_LENGTH] = { 0 };
    memset(appDir, 0, MAX_FILEPATH_LENGTH);

#if defined(_WIN32)
    int len = 0;
#if defined(UNICODE)
    unsigned short widePath[MAX_PATH];
    len = GetModuleFileNameW(NULL, widePath, MAX_PATH);
    len = WideCharToMultiByte(0, 0, widePath, len, appDir, MAX_PATH, NULL, NULL);
#else
    len = GetModuleFileNameA(NULL, appDir, MAX_PATH);
#endif
    if (len > 0)
    {
        for (int i = len; i >= 0; --i)
        {
            if (appDir[i] == '\\')
            {
                appDir[i + 1] = '\0';
                break;
            }
        }
    }
    else
    {
        appDir[0] = '.';
        appDir[1] = '\\';
    }

#elif defined(__linux__)
    unsigned int size = sizeof(appDir);
    ssize_t len = readlink("/proc/self/exe", appDir, size);

    if (len > 0)
    {
        for (int i = len; i >= 0; --i)
        {
            if (appDir[i] == '/')
            {
                appDir[i + 1] = '\0';
                break;
            }
        }
    }
    else
    {
        appDir[0] = '.';
        appDir[1] = '/';
    }
#elif defined(__APPLE__)
    uint32_t size = sizeof(appDir);

    if (_NSGetExecutablePath(appDir, &size) == 0)
    {
        int len = strlen(appDir);
        for (int i = len; i >= 0; --i)
        {
            if (appDir[i] == '/')
            {
                appDir[i + 1] = '\0';
                break;
            }
        }
    }
    else
    {
        appDir[0] = '.';
        appDir[1] = '/';
    }
#elif defined(__FreeBSD__)
    size_t size = sizeof(appDir);
    int mib[4] = {CTL_KERN, KERN_PROC, KERN_PROC_PATHNAME, -1};

    if (sysctl(mib, 4, appDir, &size, NULL, 0) == 0)
    {
        int len = strlen(appDir);
        for (int i = len; i >= 0; --i)
        {
            if (appDir[i] == '/')
            {
                appDir[i + 1] = '\0';
                break;
            }
        }
    }
    else
    {
        appDir[0] = '.';
        appDir[1] = '/';
    }

#endif

    return appDir;
}